

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void strftimeFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  uchar uVar1;
  uint uVar2;
  uint uVar3;
  undefined8 uVar4;
  int iVar5;
  uint uVar6;
  uchar *puVar7;
  char *pcVar8;
  char cVar9;
  char c;
  long lVar10;
  ulong uVar11;
  char *pcVar13;
  ulong uVar14;
  long in_FS_OFFSET;
  double dVar15;
  undefined1 local_b8 [16];
  undefined1 *local_a8;
  undefined1 *puStack_a0;
  double local_98;
  ushort uStack_90;
  undefined6 uStack_8e;
  undefined1 local_88 [32];
  undefined1 local_68 [12];
  uint uStack_5c;
  undefined8 local_58;
  undefined1 *puStack_50;
  double local_48;
  undefined1 *puStack_40;
  long local_38;
  ulong uVar12;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  stack0xffffffffffffffa0 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_88._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
  if ((argc != 0) && (puVar7 = sqlite3_value_text(*argv), puVar7 != (uchar *)0x0)) {
    local_48 = -NAN;
    iVar5 = isDate(context,argc + -1,argv + 1,(DateTime *)local_68);
    if (iVar5 == 0) {
      local_88._20_4_ = context->pOut->db->aLimit[0];
      local_88._0_8_ = (sqlite3 *)0x0;
      local_88._8_8_ = (char *)0x0;
      local_88._16_4_ = 0;
      local_88._24_8_ = local_88._24_8_ & 0xffff000000000000;
      computeJD((DateTime *)local_68);
      computeYMD_HMS((DateTime *)local_68);
      uVar14 = 0;
      uVar11 = 0;
      while( true ) {
        if (puVar7[uVar11] != '%') break;
        if (uVar14 < uVar11) {
          sqlite3_str_append((sqlite3_str *)local_88,(char *)(puVar7 + uVar14),
                             (int)uVar11 - (int)uVar14);
        }
        uVar4 = _uStack_90;
        uVar12 = uVar11 + 1;
        uVar1 = puVar7[uVar11 + 1];
        uVar14 = uVar11 + 2;
        uStack_90._0_1_ = (byte)puStack_40;
        uStack_8e = (undefined6)((ulong)puStack_40 >> 0x10);
        _uStack_90 = uVar4;
        switch(uVar1) {
        case 'F':
          pcVar13 = "%04d-%02d-%02d";
          uVar6 = uStack_5c;
          uVar2 = local_68._8_4_;
          uVar3 = (uint)local_58;
          goto LAB_0019f828;
        case 'G':
        case 'g':
          local_b8._8_8_ = stack0xffffffffffffffa0;
          local_98 = local_48;
          local_a8 = local_58;
          puStack_a0 = puStack_50;
          local_b8._0_8_ =
               local_68._0_8_ +
               (long)((3 - (int)((long)((ulong)(uint)((int)((long)(local_68._0_8_ + 43200000) /
                                                           86400000) >> 0x1f) << 0x20 |
                                       (long)(local_68._0_8_ + 43200000) / 86400000 & 0xffffffffU) %
                                7)) * 86400000);
          uStack_90._1_1_ = '\0';
          computeYMD((DateTime *)local_b8);
          if (uVar1 == 'g') {
            uVar11 = (long)(int)local_b8._8_4_ % 100 & 0xffffffff;
            goto LAB_0019f7ed;
          }
          pcVar13 = "%04d";
          uVar6 = local_b8._8_4_;
          goto LAB_0019f745;
        case 'H':
        case 'k':
          pcVar13 = "%2d";
          if (uVar1 == 'H') {
            pcVar13 = "%02d";
          }
          uVar11 = (ulong)local_58._4_4_;
          break;
        case 'I':
        case 'l':
          uVar6 = local_58._4_4_ - 0xc;
          if ((int)local_58._4_4_ < 0xd) {
            uVar6 = local_58._4_4_;
          }
          uVar11 = (ulong)uVar6;
          if (uVar6 == 0) {
            uVar11 = 0xc;
          }
          pcVar13 = "%2d";
          if (uVar1 == 'I') {
            pcVar13 = "%02d";
          }
          break;
        case 'J':
          dVar15 = (double)(long)local_68._0_8_ / 86400000.0;
          pcVar13 = "%.16g";
          goto LAB_0019f86e;
        case 'K':
        case 'L':
        case 'N':
        case 'O':
        case 'Q':
        case 'X':
        case 'Z':
        case '[':
        case '\\':
        case ']':
        case '^':
        case '_':
        case '`':
        case 'a':
        case 'b':
        case 'c':
        case 'h':
        case 'i':
        case 'n':
        case 'o':
        case 'q':
        case 'r':
        case 't':
        case 'v':
          goto switchD_0019f499_caseD_4b;
        case 'M':
          uVar11 = (ulong)puStack_50 & 0xffffffff;
          goto LAB_0019f7ed;
        case 'P':
        case 'p':
          if ((int)local_58._4_4_ < 0xc) {
            pcVar13 = "am";
            pcVar8 = "AM";
          }
          else {
            pcVar13 = "pm";
            pcVar8 = "PM";
          }
          if (uVar1 == 'p') {
            pcVar13 = pcVar8;
          }
          sqlite3_str_append((sqlite3_str *)local_88,pcVar13,2);
          goto LAB_0019f801;
        case 'R':
          sqlite3_str_appendf((sqlite3_str *)local_88,"%02d:%02d",(ulong)local_58._4_4_,
                              (ulong)puStack_50 & 0xffffffff);
          goto LAB_0019f801;
        case 'S':
          uVar11 = (ulong)(uint)(int)local_48;
          goto LAB_0019f7ed;
        case 'T':
          pcVar13 = "%02d:%02d:%02d";
          uVar6 = (uint)puStack_50;
          uVar2 = local_58._4_4_;
          uVar3 = (int)local_48;
LAB_0019f828:
          sqlite3_str_appendf((sqlite3_str *)local_88,pcVar13,(ulong)uVar2,(ulong)uVar6,(ulong)uVar3
                             );
          goto LAB_0019f801;
        case 'U':
          iVar5 = daysAfterJan01((DateTime *)local_68);
          lVar10 = 0x7b98a00;
          goto LAB_0019f71d;
        case 'V':
          local_b8._8_8_ = stack0xffffffffffffffa0;
          local_98 = local_48;
          local_a8 = local_58;
          puStack_a0 = puStack_50;
          local_b8._0_8_ =
               local_68._0_8_ +
               (long)((3 - (int)((long)((ulong)(uint)((int)((long)(local_68._0_8_ + 43200000) /
                                                           86400000) >> 0x1f) << 0x20 |
                                       (long)(local_68._0_8_ + 43200000) / 86400000 & 0xffffffffU) %
                                7)) * 86400000);
          uStack_90._1_1_ = '\0';
          computeYMD((DateTime *)local_b8);
          iVar5 = daysAfterJan01((DateTime *)local_b8);
          uVar11 = (ulong)(iVar5 / 7 + 1);
          goto LAB_0019f7ed;
        case 'W':
          iVar5 = daysAfterJan01((DateTime *)local_68);
          lVar10 = 43200000;
LAB_0019f71d:
          uVar6 = ((iVar5 - (int)((long)((ulong)(uint)((int)((long)(local_68._0_8_ + lVar10) /
                                                            86400000) >> 0x1f) << 0x20 |
                                        (long)(local_68._0_8_ + lVar10) / 86400000 & 0xffffffffU) %
                                 7)) + 7) / 7;
          pcVar13 = "%02d";
LAB_0019f745:
          uVar11 = (ulong)uVar6;
          break;
        case 'Y':
          uVar11 = (ulong)stack0xffffffffffffffa0 & 0xffffffff;
          pcVar13 = "%04d";
          break;
        case 'd':
        case 'e':
          pcVar13 = "%2d";
          if (uVar1 == 'd') {
            pcVar13 = "%02d";
          }
          uVar11 = (ulong)local_58 & 0xffffffff;
          break;
        case 'f':
          dVar15 = 59.999;
          if (local_48 <= 59.999) {
            dVar15 = local_48;
          }
          pcVar13 = "%06.3f";
LAB_0019f86e:
          sqlite3_str_appendf((sqlite3_str *)local_88,pcVar13,dVar15);
          goto LAB_0019f801;
        case 'j':
          iVar5 = daysAfterJan01((DateTime *)local_68);
          uVar11 = (ulong)(iVar5 + 1);
          pcVar13 = "%03d";
          break;
        case 'm':
          uVar11 = (ulong)uStack_5c;
LAB_0019f7ed:
          pcVar13 = "%02d";
          break;
        case 's':
          if (((ulong)puStack_40 & 0x400000000) != 0) {
            dVar15 = (double)(long)(local_68._0_8_ + -0xbfc83e532200) / 1000.0;
            pcVar13 = "%.3f";
            goto LAB_0019f86e;
          }
          sqlite3_str_appendf((sqlite3_str *)local_88,"%lld",
                              (long)local_68._0_8_ / 1000 + -0x3118a36940);
          goto LAB_0019f801;
        case 'u':
        case 'w':
          lVar10 = (long)((ulong)(uint)((int)((long)(local_68._0_8_ + 0x7b98a00) / 86400000) >> 0x1f
                                       ) << 0x20 |
                         (long)(local_68._0_8_ + 0x7b98a00) / 86400000 & 0xffffffffU) % 7;
          cVar9 = (char)lVar10 + '0';
          c = cVar9;
          if ((int)lVar10 == 0) {
            c = '7';
          }
          if (uVar1 != 'u') {
            c = cVar9;
          }
LAB_0019f5f4:
          sqlite3_str_appendchar((sqlite3_str *)local_88,1,c);
          goto LAB_0019f801;
        default:
          if (uVar1 == '%') {
            c = '%';
            goto LAB_0019f5f4;
          }
          goto switchD_0019f499_caseD_4b;
        }
        sqlite3_str_appendf((sqlite3_str *)local_88,pcVar13,uVar11);
LAB_0019f801:
        uVar11 = uVar12 + 1;
      }
      uVar12 = uVar11;
      if (puVar7[uVar11] != '\0') goto LAB_0019f801;
      if (uVar14 < uVar11) {
        sqlite3_str_append((sqlite3_str *)local_88,(char *)(puVar7 + uVar14),
                           (int)uVar11 - (int)uVar14);
      }
      sqlite3ResultStrAccum(context,(StrAccum *)local_88);
    }
  }
LAB_0019f8a1:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
switchD_0019f499_caseD_4b:
  sqlite3_str_reset((StrAccum *)local_88);
  goto LAB_0019f8a1;
}

Assistant:

static void strftimeFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  DateTime x;
  size_t i,j;
  sqlite3 *db;
  const char *zFmt;
  sqlite3_str sRes;


  if( argc==0 ) return;
  zFmt = (const char*)sqlite3_value_text(argv[0]);
  if( zFmt==0 || isDate(context, argc-1, argv+1, &x) ) return;
  db = sqlite3_context_db_handle(context);
  sqlite3StrAccumInit(&sRes, 0, 0, 0, db->aLimit[SQLITE_LIMIT_LENGTH]);

  computeJD(&x);
  computeYMD_HMS(&x);
  for(i=j=0; zFmt[i]; i++){
    char cf;
    if( zFmt[i]!='%' ) continue;
    if( j<i ) sqlite3_str_append(&sRes, zFmt+j, (int)(i-j));
    i++;
    j = i + 1;
    cf = zFmt[i];
    switch( cf ){
      case 'd':  /* Fall thru */
      case 'e': {
        sqlite3_str_appendf(&sRes, cf=='d' ? "%02d" : "%2d", x.D);
        break;
      }
      case 'f': {  /* Fractional seconds.  (Non-standard) */
        double s = x.s;
        if( NEVER(s>59.999) ) s = 59.999;
        sqlite3_str_appendf(&sRes, "%06.3f", s);
        break;
      }
      case 'F': {
        sqlite3_str_appendf(&sRes, "%04d-%02d-%02d", x.Y, x.M, x.D);
        break;
      }
      case 'G': /* Fall thru */
      case 'g': {
        DateTime y = x;
        assert( y.validJD );
        /* Move y so that it is the Thursday in the same week as x */
        y.iJD += (3 - daysAfterMonday(&x))*86400000;
        y.validYMD = 0;
        computeYMD(&y);
        if( cf=='g' ){
          sqlite3_str_appendf(&sRes, "%02d", y.Y%100);
        }else{
          sqlite3_str_appendf(&sRes, "%04d", y.Y);
        }
        break;
      }
      case 'H':
      case 'k': {
        sqlite3_str_appendf(&sRes, cf=='H' ? "%02d" : "%2d", x.h);
        break;
      }
      case 'I': /* Fall thru */
      case 'l': {
        int h = x.h;
        if( h>12 ) h -= 12;
        if( h==0 ) h = 12;
        sqlite3_str_appendf(&sRes, cf=='I' ? "%02d" : "%2d", h);
        break;
      }
      case 'j': {  /* Day of year.  Jan01==1, Jan02==2, and so forth */
        sqlite3_str_appendf(&sRes,"%03d",daysAfterJan01(&x)+1);
        break;
      }
      case 'J': {  /* Julian day number.  (Non-standard) */
        sqlite3_str_appendf(&sRes,"%.16g",x.iJD/86400000.0);
        break;
      }
      case 'm': {
        sqlite3_str_appendf(&sRes,"%02d",x.M);
        break;
      }
      case 'M': {
        sqlite3_str_appendf(&sRes,"%02d",x.m);
        break;
      }
      case 'p': /* Fall thru */
      case 'P': {
        if( x.h>=12 ){
          sqlite3_str_append(&sRes, cf=='p' ? "PM" : "pm", 2);
        }else{
          sqlite3_str_append(&sRes, cf=='p' ? "AM" : "am", 2);
        }
        break;
      }
      case 'R': {
        sqlite3_str_appendf(&sRes, "%02d:%02d", x.h, x.m);
        break;
      }
      case 's': {
        if( x.useSubsec ){
          sqlite3_str_appendf(&sRes,"%.3f",
                (x.iJD - 21086676*(i64)10000000)/1000.0);
        }else{
          i64 iS = (i64)(x.iJD/1000 - 21086676*(i64)10000);
          sqlite3_str_appendf(&sRes,"%lld",iS);
        }
        break;
      }
      case 'S': {
        sqlite3_str_appendf(&sRes,"%02d",(int)x.s);
        break;
      }
      case 'T': {
        sqlite3_str_appendf(&sRes,"%02d:%02d:%02d", x.h, x.m, (int)x.s);
        break;
      }
      case 'u':    /* Day of week.  1 to 7.  Monday==1, Sunday==7 */
      case 'w': {  /* Day of week.  0 to 6.  Sunday==0, Monday==1 */
        char c = (char)daysAfterSunday(&x) + '0';
        if( c=='0' && cf=='u' ) c = '7';
        sqlite3_str_appendchar(&sRes, 1, c);
        break;
      }
      case 'U': {  /* Week num. 00-53. First Sun of the year is week 01 */
        sqlite3_str_appendf(&sRes,"%02d",
              (daysAfterJan01(&x)-daysAfterSunday(&x)+7)/7);
        break;
      }
      case 'V': {  /* Week num. 01-53. First week with a Thur is week 01 */
        DateTime y = x;
        /* Adjust y so that is the Thursday in the same week as x */
        assert( y.validJD );
        y.iJD += (3 - daysAfterMonday(&x))*86400000;
        y.validYMD = 0;
        computeYMD(&y);
        sqlite3_str_appendf(&sRes,"%02d", daysAfterJan01(&y)/7+1);
        break;
      }
      case 'W': {  /* Week num. 00-53. First Mon of the year is week 01 */
        sqlite3_str_appendf(&sRes,"%02d",
           (daysAfterJan01(&x)-daysAfterMonday(&x)+7)/7);
        break;
      }
      case 'Y': {
        sqlite3_str_appendf(&sRes,"%04d",x.Y);
        break;
      }
      case '%': {
        sqlite3_str_appendchar(&sRes, 1, '%');
        break;
      }
      default: {
        sqlite3_str_reset(&sRes);
        return;
      }
    }
  }
  if( j<i ) sqlite3_str_append(&sRes, zFmt+j, (int)(i-j));
  sqlite3ResultStrAccum(context, &sRes);
}